

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::AggressiveDCEPass::ProcessGlobalValues(AggressiveDCEPass *this)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Op OVar4;
  CommonDebugInfoInstructions CVar5;
  uint32_t uVar6;
  IRContext *pIVar7;
  iterator iVar8;
  iterator iVar9;
  reference ppIVar10;
  DebugInfoManager *this_00;
  Instruction *pIVar11;
  Operand *pOVar12;
  DefUseManager *pDVar13;
  Instruction *pIVar14;
  size_type sVar15;
  Instruction *var;
  undefined1 local_1f8 [4];
  uint32_t i_2;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  Instruction *entry;
  iterator __end3;
  iterator __begin3;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range3;
  Instruction *local_1a8;
  Instruction *ptr_ty_inst;
  Instruction *pIStack_198;
  uint32_t ptr_ty_id;
  Instruction *val;
  iterator __end2_3;
  iterator __begin2_3;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_3;
  undefined1 local_15c [12];
  Instruction *local_150;
  SmallVector<unsigned_int,_2UL> local_148;
  Instruction *local_120;
  Instruction *var_inst;
  Instruction *pIStack_110;
  uint32_t var_id;
  Instruction *dbg;
  iterator __end2_2;
  iterator __begin2_2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_2;
  Instruction *opInst_1;
  uint32_t i_1;
  bool removed_operand_1;
  bool dead_1;
  Instruction *opInst;
  uint32_t i;
  bool removed_operand;
  bool dead;
  Instruction *counter_buffer_inst;
  uint32_t counter_buffer_id;
  Instruction *annotation;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  DebugScope local_78;
  DebugScope local_70;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> annotations;
  Instruction *local_20;
  Instruction *instruction;
  bool modified;
  AggressiveDCEPass *this_local;
  
  instruction._7_1_ = false;
  Pass::get_module((Pass *)this);
  Module::debug2_begin
            ((Module *)
             &annotations.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_20 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)
                        &annotations.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while (local_20 != (Instruction *)0x0) {
    OVar4 = opt::Instruction::opcode(local_20);
    if (OVar4 == OpName) {
      bVar2 = IsTargetDead(this,local_20);
      if (bVar2) {
        pIVar7 = Pass::context((Pass *)this);
        local_20 = IRContext::KillInst(pIVar7,local_20);
        instruction._7_1_ = true;
      }
      else {
        local_20 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                             (&local_20->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      }
    }
    else {
      local_20 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                           (&local_20->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    }
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  Pass::get_module((Pass *)this);
  Module::annotations((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  while (bVar2 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar2) {
    local_78 = (DebugScope)
               utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    local_70 = local_78;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range2,(value_type *)&local_78);
    InstructionList::iterator::operator++(&__end2);
  }
  iVar8 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&__range2);
  iVar9 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range2);
  std::
  sort<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,spvtools::opt::(anonymous_namespace)::DecorationLess>
            (iVar8._M_current,iVar9._M_current);
  __end2_1 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
  annotation = (Instruction *)
               std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                             *)&annotation), bVar2) {
    ppIVar10 = __gnu_cxx::
               __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
               ::operator*(&__end2_1);
    pIVar14 = *ppIVar10;
    OVar4 = opt::Instruction::opcode(pIVar14);
    if (OVar4 - OpDecorate < 2) {
LAB_0089d1dc:
      bVar2 = IsTargetDead(this,pIVar14);
      if (bVar2) {
        pIVar7 = Pass::context((Pass *)this);
        IRContext::KillInst(pIVar7,pIVar14);
        instruction._7_1_ = true;
      }
    }
    else if (OVar4 == OpDecorationGroup) {
      pDVar13 = Pass::get_def_use_mgr((Pass *)this);
      uVar6 = analysis::DefUseManager::NumUsers(pDVar13,pIVar14);
      if (uVar6 == 0) {
        pIVar7 = Pass::context((Pass *)this);
        IRContext::KillInst(pIVar7,pIVar14);
        instruction._7_1_ = true;
      }
    }
    else if (OVar4 == OpGroupDecorate) {
      bVar2 = true;
      bVar1 = false;
      opInst._0_4_ = 1;
      while (uVar6 = opt::Instruction::NumOperands(pIVar14), (uint)opInst < uVar6) {
        pDVar13 = Pass::get_def_use_mgr((Pass *)this);
        uVar6 = opt::Instruction::GetSingleWordOperand(pIVar14,(uint)opInst);
        pIVar11 = analysis::DefUseManager::GetDef(pDVar13,uVar6);
        bVar3 = IsLive(this,pIVar11);
        if (bVar3) {
          opInst._0_4_ = (uint)opInst + 1;
          bVar2 = false;
        }
        else {
          opt::Instruction::RemoveOperand(pIVar14,(uint)opInst);
          instruction._7_1_ = true;
          bVar1 = true;
        }
      }
      if (bVar2) {
        pIVar7 = Pass::context((Pass *)this);
        IRContext::KillInst(pIVar7,pIVar14);
        instruction._7_1_ = true;
      }
      else if (bVar1) {
        pIVar7 = Pass::context((Pass *)this);
        IRContext::UpdateDefUse(pIVar7,pIVar14);
      }
    }
    else if (OVar4 == OpGroupMemberDecorate) {
      bVar2 = true;
      bVar1 = false;
      opInst_1._0_4_ = 1;
      while (uVar6 = opt::Instruction::NumOperands(pIVar14), (uint)opInst_1 < uVar6) {
        pDVar13 = Pass::get_def_use_mgr((Pass *)this);
        uVar6 = opt::Instruction::GetSingleWordOperand(pIVar14,(uint)opInst_1);
        pIVar11 = analysis::DefUseManager::GetDef(pDVar13,uVar6);
        bVar3 = IsLive(this,pIVar11);
        if (bVar3) {
          opInst_1._0_4_ = (uint)opInst_1 + 2;
          bVar2 = false;
        }
        else {
          opt::Instruction::RemoveOperand(pIVar14,(uint)opInst_1 + 1);
          opt::Instruction::RemoveOperand(pIVar14,(uint)opInst_1);
          instruction._7_1_ = true;
          bVar1 = true;
        }
      }
      if (bVar2) {
        pIVar7 = Pass::context((Pass *)this);
        IRContext::KillInst(pIVar7,pIVar14);
        instruction._7_1_ = true;
      }
      else if (bVar1) {
        pIVar7 = Pass::context((Pass *)this);
        IRContext::UpdateDefUse(pIVar7,pIVar14);
      }
    }
    else {
      if (OVar4 != OpDecorateId) {
        if (OVar4 != OpDecorateString && OVar4 != OpMemberDecorateString) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                        ,0x381,"bool spvtools::opt::AggressiveDCEPass::ProcessGlobalValues()");
        }
        goto LAB_0089d1dc;
      }
      bVar2 = IsTargetDead(this,pIVar14);
      if (bVar2) {
        pIVar7 = Pass::context((Pass *)this);
        IRContext::KillInst(pIVar7,pIVar14);
        instruction._7_1_ = true;
      }
      else {
        uVar6 = opt::Instruction::GetSingleWordInOperand(pIVar14,1);
        if (uVar6 == 0x1602) {
          uVar6 = opt::Instruction::GetSingleWordInOperand(pIVar14,2);
          pDVar13 = Pass::get_def_use_mgr((Pass *)this);
          pIVar11 = analysis::DefUseManager::GetDef(pDVar13,uVar6);
          bVar2 = IsLive(this,pIVar11);
          if (!bVar2) {
            pIVar7 = Pass::context((Pass *)this);
            IRContext::KillInst(pIVar7,pIVar14);
            instruction._7_1_ = true;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2_1);
  }
  Pass::get_module((Pass *)this);
  Module::ext_inst_debuginfo((Module *)&__begin2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&dbg);
  while (bVar2 = utils::operator!=(&__end2_2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&dbg), bVar2) {
    pIStack_110 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end2_2.super_iterator)
    ;
    bVar2 = IsLive(this,pIStack_110);
    if (!bVar2) {
      CVar5 = opt::Instruction::GetCommonDebugOpcode(pIStack_110);
      if (CVar5 == CommonDebugInfoDebugGlobalVariable) {
        var_inst._4_4_ = opt::Instruction::GetSingleWordOperand(pIStack_110,0xc);
        pDVar13 = Pass::get_def_use_mgr((Pass *)this);
        local_120 = analysis::DefUseManager::GetDef(pDVar13,var_inst._4_4_);
        bVar2 = IsLive(this,local_120);
        if (!bVar2) {
          pIVar7 = Pass::context((Pass *)this);
          IRContext::ForgetUses(pIVar7,pIStack_110);
          pIVar14 = pIStack_110;
          pIVar7 = Pass::context((Pass *)this);
          this_00 = IRContext::get_debug_info_mgr(pIVar7);
          pIVar11 = analysis::DebugInfoManager::GetDebugInfoNone(this_00);
          local_15c._0_4_ = opt::Instruction::result_id(pIVar11);
          local_15c._4_8_ = local_15c;
          local_150 = (Instruction *)0x1;
          init_list._M_len = 1;
          init_list._M_array = (iterator)local_15c._4_8_;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_148,init_list);
          opt::Instruction::SetOperand(pIVar14,0xc,&local_148);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_148);
          pIVar7 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar7,pIStack_110);
        }
      }
      else {
        __range2_3 = (IteratorRange<spvtools::opt::InstructionList::iterator> *)pIStack_110;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back(&this->to_kill_,(value_type *)&__range2_3);
        instruction._7_1_ = true;
      }
    }
    InstructionList::iterator::operator++(&__end2_2);
  }
  Pass::get_module((Pass *)this);
  Module::types_values((Module *)&__begin2_3);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_3);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&val);
  do {
    bVar2 = utils::operator!=(&__end2_3.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&val);
    if (!bVar2) {
      if ((this->preserve_interface_ & 1U) == 0) {
        Pass::get_module((Pass *)this);
        Module::entry_points((Module *)&__begin3);
        IteratorRange<spvtools::opt::InstructionList::iterator>::begin
                  ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end3);
        IteratorRange<spvtools::opt::InstructionList::iterator>::end
                  ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry);
        while (bVar2 = utils::operator!=(&__end3.super_iterator,
                                         (iterator_template<spvtools::opt::Instruction> *)&entry),
              bVar2) {
          new_operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)utils::IntrusiveList<spvtools::opt::Instruction>::
                        iterator_template<spvtools::opt::Instruction>::operator*
                                  (&__end3.super_iterator);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_1f8);
          for (var._4_4_ = 0;
              uVar6 = opt::Instruction::NumInOperands
                                ((Instruction *)
                                 new_operands.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage),
              var._4_4_ < uVar6; var._4_4_ = var._4_4_ + 1) {
            if (var._4_4_ < 3) {
              pOVar12 = opt::Instruction::GetInOperand
                                  ((Instruction *)
                                   new_operands.
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,var._4_4_);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_1f8,pOVar12);
            }
            else {
              pDVar13 = Pass::get_def_use_mgr((Pass *)this);
              uVar6 = opt::Instruction::GetSingleWordInOperand
                                ((Instruction *)
                                 new_operands.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,var._4_4_);
              pIVar14 = analysis::DefUseManager::GetDef(pDVar13,uVar6);
              bVar2 = IsLive(this,pIVar14);
              if (bVar2) {
                pOVar12 = opt::Instruction::GetInOperand
                                    ((Instruction *)
                                     new_operands.
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,var._4_4_);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *
                          )local_1f8,pOVar12);
              }
            }
          }
          sVar15 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                   size((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_1f8);
          uVar6 = opt::Instruction::NumInOperands
                            ((Instruction *)
                             new_operands.
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar15 != uVar6) {
            opt::Instruction::SetInOperands
                      ((Instruction *)
                       new_operands.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(OperandList *)local_1f8);
            pDVar13 = Pass::get_def_use_mgr((Pass *)this);
            analysis::DefUseManager::UpdateDefUse
                      (pDVar13,(Instruction *)
                               new_operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_1f8);
          InstructionList::iterator::operator++(&__end3);
        }
      }
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range2);
      return instruction._7_1_;
    }
    pIStack_198 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end2_3.super_iterator)
    ;
    bVar2 = IsLive(this,pIStack_198);
    if (!bVar2) {
      OVar4 = opt::Instruction::opcode(pIStack_198);
      if (OVar4 == OpTypeForwardPointer) {
        ptr_ty_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIStack_198,0);
        pDVar13 = Pass::get_def_use_mgr((Pass *)this);
        local_1a8 = analysis::DefUseManager::GetDef(pDVar13,ptr_ty_inst._4_4_);
        bVar2 = IsLive(this,local_1a8);
        if (bVar2) goto LAB_0089d8df;
      }
      __range3 = (IteratorRange<spvtools::opt::InstructionList::iterator> *)pIStack_198;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(&this->to_kill_,(value_type *)&__range3);
      instruction._7_1_ = true;
    }
LAB_0089d8df:
    InstructionList::iterator::operator++(&__end2_3);
  } while( true );
}

Assistant:

bool AggressiveDCEPass::ProcessGlobalValues() {
  // Remove debug and annotation statements referencing dead instructions.
  // This must be done before killing the instructions, otherwise there are
  // dead objects in the def/use database.
  bool modified = false;
  Instruction* instruction = &*get_module()->debug2_begin();
  while (instruction) {
    if (instruction->opcode() != spv::Op::OpName) {
      instruction = instruction->NextNode();
      continue;
    }

    if (IsTargetDead(instruction)) {
      instruction = context()->KillInst(instruction);
      modified = true;
    } else {
      instruction = instruction->NextNode();
    }
  }

  // This code removes all unnecessary decorations safely (see #1174). It also
  // does so in a more efficient manner than deleting them only as the targets
  // are deleted.
  std::vector<Instruction*> annotations;
  for (auto& inst : get_module()->annotations()) annotations.push_back(&inst);
  std::sort(annotations.begin(), annotations.end(), DecorationLess());
  for (auto annotation : annotations) {
    switch (annotation->opcode()) {
      case spv::Op::OpDecorate:
      case spv::Op::OpMemberDecorate:
      case spv::Op::OpDecorateStringGOOGLE:
      case spv::Op::OpMemberDecorateStringGOOGLE:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      case spv::Op::OpDecorateId:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        } else {
          if (spv::Decoration(annotation->GetSingleWordInOperand(1)) ==
              spv::Decoration::HlslCounterBufferGOOGLE) {
            // HlslCounterBuffer will reference an id other than the target.
            // If that id is dead, then the decoration can be removed as well.
            uint32_t counter_buffer_id = annotation->GetSingleWordInOperand(2);
            Instruction* counter_buffer_inst =
                get_def_use_mgr()->GetDef(counter_buffer_id);
            if (!IsLive(counter_buffer_inst)) {
              context()->KillInst(annotation);
              modified = true;
            }
          }
        }
        break;
      case spv::Op::OpGroupDecorate: {
        // Go through the targets of this group decorate. Remove each dead
        // target. If all targets are dead, remove this decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i++;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpGroupMemberDecorate: {
        // Go through the targets of this group member decorate. Remove each
        // dead target (and member index). If all targets are dead, remove this
        // decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i + 1);
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i += 2;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpDecorationGroup:
        // By the time we hit decoration groups we've checked everything that
        // can target them. So if they have no uses they must be dead.
        if (get_def_use_mgr()->NumUsers(annotation) == 0) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      default:
        assert(false);
        break;
    }
  }

  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (IsLive(&dbg)) continue;
    // Save GlobalVariable if its variable is live, otherwise null out variable
    // index
    if (dbg.GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
      auto var_id = dbg.GetSingleWordOperand(kGlobalVariableVariableIndex);
      Instruction* var_inst = get_def_use_mgr()->GetDef(var_id);
      if (IsLive(var_inst)) continue;
      context()->ForgetUses(&dbg);
      dbg.SetOperand(
          kGlobalVariableVariableIndex,
          {context()->get_debug_info_mgr()->GetDebugInfoNone()->result_id()});
      context()->AnalyzeUses(&dbg);
      continue;
    }
    to_kill_.push_back(&dbg);
    modified = true;
  }

  // Since ADCE is disabled for non-shaders, we don't check for export linkage
  // attributes here.
  for (auto& val : get_module()->types_values()) {
    if (!IsLive(&val)) {
      // Save forwarded pointer if pointer is live since closure does not mark
      // this live as it does not have a result id. This is a little too
      // conservative since it is not known if the structure type that needed
      // it is still live. TODO(greg-lunarg): Only save if needed.
      if (val.opcode() == spv::Op::OpTypeForwardPointer) {
        uint32_t ptr_ty_id = val.GetSingleWordInOperand(0);
        Instruction* ptr_ty_inst = get_def_use_mgr()->GetDef(ptr_ty_id);
        if (IsLive(ptr_ty_inst)) continue;
      }
      to_kill_.push_back(&val);
      modified = true;
    }
  }

  if (!preserve_interface_) {
    // Remove the dead interface variables from the entry point interface list.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        if (i < 3) {
          // Execution model, function id and name are always valid.
          new_operands.push_back(entry.GetInOperand(i));
        } else {
          auto* var =
              get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
          if (IsLive(var)) {
            new_operands.push_back(entry.GetInOperand(i));
          }
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        get_def_use_mgr()->UpdateDefUse(&entry);
      }
    }
  }

  return modified;
}